

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall cfd::core::DescriptorNode::AnalyzeScriptTree(DescriptorNode *this)

{
  string *psVar1;
  char cVar2;
  ulong uVar3;
  CfdException *this_00;
  ulong uVar4;
  uint32_t script_depth;
  allocator local_229;
  undefined1 local_228 [32];
  vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>> *local_208;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
  *local_200;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_1f8;
  string temp_name;
  string tapscript;
  DescriptorNode node;
  
  script_depth = 0;
  psVar1 = &this->value_;
  tapscript._M_dataplus._M_p = (pointer)&tapscript.field_2;
  tapscript._M_string_length = 0;
  temp_name._M_dataplus._M_p = (pointer)&temp_name.field_2;
  temp_name._M_string_length = 0;
  tapscript.field_2._M_local_buf[0] = '\0';
  temp_name.field_2._M_local_buf[0] = '\0';
  local_1f8 = &this->addr_prefixes_;
  local_200 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
               *)&this->tree_node_;
  local_208 = (vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>> *)
              &this->child_node_;
  for (uVar4 = 0; uVar3 = (this->value_)._M_string_length, uVar4 < uVar3; uVar4 = uVar4 + 1) {
    cVar2 = (psVar1->_M_dataplus)._M_p[uVar4];
    if (cVar2 != ' ') {
      if (cVar2 == '(') {
        if (script_depth == 0) {
          ::std::__cxx11::string::substr((ulong)&node,(ulong)psVar1);
          ::std::__cxx11::string::operator=((string *)&temp_name,(string *)&node);
          ::std::__cxx11::string::~string((string *)&node);
        }
        node.name_._M_dataplus._M_p = "cfdcore_descriptor.cpp";
        node.name_._M_string_length._0_4_ = 0x61a;
        node.name_.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_525098;
        logger::info<unsigned_int&,std::__cxx11::string&>
                  ((CfdSourceLocation *)&node,"Target`(` script_depth={}, name={}",&script_depth,
                   &temp_name);
        script_depth = script_depth + 1;
      }
      else if (cVar2 == ')') {
        script_depth = script_depth - 1;
        node.name_._M_dataplus._M_p = "cfdcore_descriptor.cpp";
        node.name_._M_string_length._0_4_ = 0x61f;
        node.name_.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_525098;
        logger::info<unsigned_int&>
                  ((CfdSourceLocation *)&node,"Target`)` script_depth = {}",&script_depth);
        if (script_depth == 0) {
          ::std::__cxx11::string::substr((ulong)&node,(ulong)psVar1);
          ::std::__cxx11::string::operator=((string *)&tapscript,(string *)&node);
          ::std::__cxx11::string::~string((string *)&node);
          DescriptorNode(&node,local_1f8,this->network_type_);
          ::std::__cxx11::string::_M_assign((string *)&node);
          node.node_type_ = kDescriptorTypeScript;
          ::std::__cxx11::string::_M_assign((string *)&node.value_);
          node.depth_ = 1;
          ::std::__cxx11::string::assign((char *)&node.parent_kind_);
          if (temp_name._M_string_length != 0) {
            AnalyzeChild(&node,&tapscript,2);
          }
          ::std::__cxx11::string::string((string *)local_228,"tr",&local_229);
          AnalyzeAll(&node,(string *)local_228);
          ::std::__cxx11::string::~string((string *)local_228);
          ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
          ::_M_emplace_unique<std::__cxx11::string&,cfd::core::DescriptorNode&>
                    (local_200,&tapscript,&node);
          ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
          emplace_back<cfd::core::DescriptorNode&>(local_208,&node);
          ::std::__cxx11::string::assign((char *)&tapscript);
          ::std::__cxx11::string::assign((char *)&temp_name);
          local_228._0_8_ = "cfdcore_descriptor.cpp";
          local_228._8_4_ = 0x633;
          local_228._16_8_ = "AnalyzeScriptTree";
          logger::info<unsigned_int&,std::__cxx11::string&>
                    ((CfdSourceLocation *)local_228,"Target`)` script_depth={}, child.value={}",
                     &script_depth,&node.value_);
          ~DescriptorNode(&node);
        }
      }
      else if (((cVar2 == ',') || (cVar2 == '}')) && (script_depth == 0)) {
        ::std::__cxx11::string::substr((ulong)&node,(ulong)psVar1);
        ::std::__cxx11::string::operator=((string *)&tapscript,(string *)&node);
        ::std::__cxx11::string::~string((string *)&node);
        if (0x3f < tapscript._M_string_length) {
          DescriptorNode(&node,local_1f8,this->network_type_);
          ::std::__cxx11::string::_M_assign((string *)&node);
          node.node_type_ = kDescriptorTypeKey;
          ::std::__cxx11::string::_M_assign((string *)&node.value_);
          node.depth_ = 1;
          ::std::__cxx11::string::assign((char *)&node.parent_kind_);
          if (temp_name._M_string_length != 0) {
            AnalyzeChild(&node,&tapscript,2);
          }
          ::std::__cxx11::string::string((string *)local_228,"tr",&local_229);
          AnalyzeAll(&node,(string *)local_228);
          ::std::__cxx11::string::~string((string *)local_228);
          ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
          ::_M_emplace_unique<std::__cxx11::string&,cfd::core::DescriptorNode&>
                    (local_200,&tapscript,&node);
          ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
          emplace_back<cfd::core::DescriptorNode&>(local_208,&node);
          ::std::__cxx11::string::assign((char *)&tapscript);
          ::std::__cxx11::string::assign((char *)&temp_name);
          local_228._0_8_ = "cfdcore_descriptor.cpp";
          local_228._8_4_ = 0x60e;
          local_228._16_8_ = "AnalyzeScriptTree";
          logger::info<unsigned_int&,std::__cxx11::string&>
                    ((CfdSourceLocation *)local_228,"HashTarget script_depth={}, child.value={}",
                     &script_depth,&node.value_);
          ~DescriptorNode(&node);
        }
      }
    }
  }
  if ((this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (uVar3 < 0x40) {
      node.name_._M_dataplus._M_p = "cfdcore_descriptor.cpp";
      node.name_._M_string_length._0_4_ = 0x64e;
      node.name_.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_525098;
      logger::warn<>((CfdSourceLocation *)&node,"Failed to taproot. empty script.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&node,"Failed to taproot. empty script.",(allocator *)local_228);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&node.name_);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::__cxx11::string::_M_assign((string *)&tapscript);
    DescriptorNode(&node,local_1f8,this->network_type_);
    ::std::__cxx11::string::_M_assign((string *)&node);
    node.node_type_ = kDescriptorTypeKey;
    ::std::__cxx11::string::_M_assign((string *)&node.value_);
    node.depth_ = 1;
    ::std::__cxx11::string::assign((char *)&node.parent_kind_);
    if (temp_name._M_string_length != 0) {
      AnalyzeChild(&node,&tapscript,2);
    }
    ::std::__cxx11::string::string((string *)local_228,"tr",&local_229);
    AnalyzeAll(&node,(string *)local_228);
    ::std::__cxx11::string::~string((string *)local_228);
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
    ::_M_emplace_unique<std::__cxx11::string&,cfd::core::DescriptorNode&>
              (local_200,&tapscript,&node);
    ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
    emplace_back<cfd::core::DescriptorNode&>(local_208,&node);
    ::std::__cxx11::string::assign((char *)&tapscript);
    ::std::__cxx11::string::assign((char *)&temp_name);
    local_228._0_8_ = "cfdcore_descriptor.cpp";
    local_228._8_4_ = 0x64b;
    local_228._16_8_ = "AnalyzeScriptTree";
    logger::info<unsigned_int&,std::__cxx11::string&>
              ((CfdSourceLocation *)local_228,"LastTarget script_depth={}, child.value={}",
               &script_depth,&node.value_);
    ~DescriptorNode(&node);
  }
  ::std::__cxx11::string::~string((string *)&temp_name);
  ::std::__cxx11::string::~string((string *)&tapscript);
  return;
}

Assistant:

void DescriptorNode::AnalyzeScriptTree() {
  const auto& desc = value_;

  uint32_t script_depth = 0;
  size_t offset = 0;
  std::string tapscript;
  uint32_t tapleaf_count = 0;
  std::string temp_name;
  for (size_t idx = 0; idx < desc.size(); ++idx) {
    const char& str = desc[idx];
    if ((str == ' ') || (str == '{')) {
      if (script_depth == 0) ++offset;
    } else if ((str == ',') || (str == '}')) {
      if (script_depth == 0) {
        tapscript = desc.substr(offset, idx - offset);
        if (tapscript.length() >= (kByteData256Length * 2)) {
          offset = idx + 1;
          DescriptorNode node(addr_prefixes_, network_type_);
          node.name_ = temp_name;
          node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
          node.value_ = tapscript;
          node.depth_ = 1;
          node.parent_kind_ = "tr";
          if (!temp_name.empty()) {
            node.AnalyzeChild(tapscript, 2);
          }
          node.AnalyzeAll("tr");
          tree_node_.emplace(tapscript, node);
          child_node_.emplace_back(node);
          ++tapleaf_count;
          tapscript = "";
          temp_name = "";
          info(
              CFD_LOG_SOURCE, "HashTarget script_depth={}, child.value={}",
              script_depth, node.value_);
        } else {
          ++offset;
        }
      }
    } else if (str == '(') {
      if (script_depth == 0) {
        temp_name = desc.substr(offset, idx - offset);
        // offset = idx + 1;
      }
      info(
          CFD_LOG_SOURCE, "Target`(` script_depth={}, name={}", script_depth,
          temp_name);
      ++script_depth;
    } else if (str == ')') {
      --script_depth;
      info(CFD_LOG_SOURCE, "Target`)` script_depth = {}", script_depth);
      if (script_depth == 0) {
        tapscript = desc.substr(offset, idx - offset + 1);
        offset = idx + 1;
        DescriptorNode node(addr_prefixes_, network_type_);
        node.name_ = temp_name;
        node.node_type_ = DescriptorNodeType::kDescriptorTypeScript;
        node.value_ = tapscript;
        node.depth_ = 1;
        node.parent_kind_ = "tr";
        if (!temp_name.empty()) {
          node.AnalyzeChild(tapscript, 2);
        }
        node.AnalyzeAll("tr");
        tree_node_.emplace(tapscript, node);
        child_node_.emplace_back(node);
        ++tapleaf_count;
        tapscript = "";
        temp_name = "";
        info(
            CFD_LOG_SOURCE, "Target`)` script_depth={}, child.value={}",
            script_depth, node.value_);
      }
    }
  }
  if (tree_node_.empty()) {
    if (value_.length() >= (kByteData256Length * 2)) {
      tapscript = value_;
      DescriptorNode node(addr_prefixes_, network_type_);
      node.name_ = temp_name;
      node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
      node.value_ = tapscript;
      node.depth_ = 1;
      node.parent_kind_ = "tr";
      if (!temp_name.empty()) {
        node.AnalyzeChild(tapscript, 2);
      }
      node.AnalyzeAll("tr");
      tree_node_.emplace(tapscript, node);
      child_node_.emplace_back(node);
      ++tapleaf_count;
      tapscript = "";
      temp_name = "";
      info(
          CFD_LOG_SOURCE, "LastTarget script_depth={}, child.value={}",
          script_depth, node.value_);
    } else {
      warn(CFD_LOG_SOURCE, "Failed to taproot. empty script.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot. empty script.");
    }
  }
}